

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_fdset(CURLM *multi_handle,fd_set *read_fd_set,fd_set *write_fd_set,
                          fd_set *exc_fd_set,int *max_fd)

{
  uint uVar1;
  CURLMcode CVar2;
  uint uVar3;
  fd_set *pfVar4;
  uint uVar5;
  uint uVar6;
  Curl_multi *multi;
  SessionHandle *data;
  curl_socket_t sockbunch [5];
  
  CVar2 = CURLM_BAD_HANDLE;
  if ((multi_handle != (CURLM *)0x0) && (*multi_handle == 0xbab1e)) {
    data = (SessionHandle *)((long)multi_handle + 8);
    uVar5 = 0xffffffff;
    pfVar4 = write_fd_set;
LAB_004ea029:
    data = data->next;
    if (data != (SessionHandle *)0x0) {
      uVar3 = multi_getsock(data,sockbunch,(int)pfVar4);
      for (pfVar4 = (fd_set *)0x0; pfVar4 != (fd_set *)0x5;
          pfVar4 = (fd_set *)((long)pfVar4->__fds_bits + 1)) {
        uVar6 = 0xffffffff;
        if (((uVar3 >> ((uint)pfVar4 & 0x1f) & 1) != 0) &&
           (uVar1 = sockbunch[(long)pfVar4], uVar1 < 0x400)) {
          read_fd_set->__fds_bits[uVar1 >> 6] =
               read_fd_set->__fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
          uVar6 = uVar1;
        }
        if ((((uVar3 >> ((byte)pfVar4 & 0x1f)) >> 0x10 & 1) == 0) ||
           (uVar1 = sockbunch[(long)pfVar4], 0x3ff < uVar1)) {
          if (uVar6 == 0xffffffff) break;
        }
        else {
          write_fd_set->__fds_bits[uVar1 >> 6] =
               write_fd_set->__fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
          uVar6 = uVar1;
        }
        if ((int)uVar5 < (int)uVar6) {
          uVar5 = uVar6;
        }
      }
      goto LAB_004ea029;
    }
    *max_fd = uVar5;
    CVar2 = CURLM_OK;
  }
  return CVar2;
}

Assistant:

CURLMcode curl_multi_fdset(CURLM *multi_handle,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  struct Curl_multi *multi=(struct Curl_multi *)multi_handle;
  struct SessionHandle *data;
  int this_max_fd=-1;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  int i;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  data=multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if((bitmap & GETSOCK_READSOCK(i)) && VALID_SOCK((sockbunch[i]))) {
        FD_SET(sockbunch[i], read_fd_set);
        s = sockbunch[i];
      }
      if((bitmap & GETSOCK_WRITESOCK(i)) && VALID_SOCK((sockbunch[i]))) {
        FD_SET(sockbunch[i], write_fd_set);
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD)
        /* this socket is unused, break out of loop */
        break;
      else {
        if((int)s > this_max_fd)
          this_max_fd = (int)s;
      }
    }

    data = data->next; /* check next handle */
  }

  *max_fd = this_max_fd;

  return CURLM_OK;
}